

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::registerTimer(TCPSocket *this,int tt)

{
  rep rVar1;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  shared_ptr<hwnet::TCPSocket> sp;
  
  if (tt == 1) {
    if (this->ptrSendlist->head == (sendContext *)0x0) {
      return;
    }
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_30,&this->timer
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
    if (local_30 != (undefined1  [8])0x0) {
      return;
    }
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_30,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar1 = std::chrono::_V2::steady_clock::now();
    (this->lastSendTime).__d.__r = rVar1;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_40,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  else {
    if ((this->recvList).
        super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->recvList) {
      return;
    }
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_30,&this->timer
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
    if (local_30 != (undefined1  [8])0x0) {
      return;
    }
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_30,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar1 = std::chrono::_V2::steady_clock::now();
    (this->lastRecvTime).__d.__r = rVar1;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_40,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
  return;
}

Assistant:

void TCPSocket::registerTimer(int tt) {
	if(tt == timerSend) {
		//send
		if(!this->ptrSendlist->empty() && !this->timer.lock()) {
			auto sp = shared_from_this();
			this->lastSendTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}

	} else {
		//recv
		if(!this->recvListEmpty() && !this->timer.lock()) {	
			auto sp = shared_from_this();
			this->lastRecvTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}
	}
}